

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

Am_Value * __thiscall
Formula_Context::Raise_Get_Exception
          (Formula_Context *this,Am_Value *value,Am_Object_Advanced *param_2,Am_Slot_Key param_3,
          Am_Slot_Flags flags,char *param_5)

{
  char *param_5_local;
  Am_Slot_Flags flags_local;
  Am_Slot_Key param_3_local;
  Am_Object_Advanced *param_2_local;
  Am_Value *value_local;
  Formula_Context *this_local;
  
  if ((flags & 2) == 0) {
    this_local = (Formula_Context *)value;
    if ((flags & 1) == 0) {
      this->inited = false;
      Am_Value::operator=(&this->exception,value);
      this_local = (Formula_Context *)&Am_Zero_Value;
    }
  }
  else {
    this_local = (Formula_Context *)&Am_Zero_Value;
  }
  return (Am_Value *)this_local;
}

Assistant:

const Am_Value &
Formula_Context::Raise_Get_Exception(const Am_Value &value,
                                     const Am_Object_Advanced &, Am_Slot_Key,
                                     Am_Slot_Flags flags, const char *)
{
  if (flags & Am_RETURN_ZERO_ON_ERROR_BIT)
    return Am_Zero_Value;
  else if (flags & Am_OK_IF_NOT_THERE)
    return value;
  else {
    inited = false;
    exception = value;
    return Am_Zero_Value;
  }
}